

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_ech_encode_config
              (ptls_buffer_t *buf,uint8_t config_id,ptls_hpke_kem_t *kem,ptls_iovec_t public_key,
              ptls_hpke_cipher_suite_t **ciphers,uint8_t max_name_length,char *public_name)

{
  size_t sVar1;
  ptls_buffer_t *buf_00;
  int iVar2;
  size_t len;
  ulong uVar3;
  size_t body_size;
  size_t body_size_4;
  size_t body_start_4;
  size_t capacity_4;
  size_t body_size_3;
  size_t body_start_3;
  size_t capacity_3;
  ulong local_98;
  size_t body_size_2;
  uint16_t _v_3;
  long lStack_88;
  uint16_t _v_2;
  size_t i;
  size_t body_start_2;
  size_t capacity_2;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  uint16_t _v_1;
  size_t sStack_50;
  size_t body_start;
  size_t capacity;
  uint16_t _v;
  ptls_hpke_cipher_suite_t **pppStack_38;
  int ret;
  ptls_hpke_cipher_suite_t **ciphers_local;
  ptls_hpke_kem_t *kem_local;
  ptls_buffer_t *ppStack_20;
  uint8_t config_id_local;
  ptls_buffer_t *buf_local;
  ptls_iovec_t public_key_local;
  
  public_key_local.base = (uint8_t *)public_key.len;
  buf_local = (ptls_buffer_t *)public_key.base;
  capacity._2_2_ = 0xfe0d;
  capacity._0_1_ = 0xfe;
  capacity._1_1_ = 0xd;
  pppStack_38 = ciphers;
  ciphers_local = (ptls_hpke_cipher_suite_t **)kem;
  kem_local._7_1_ = config_id;
  ppStack_20 = buf;
  capacity._4_4_ = ptls_buffer__do_pushv(buf,&capacity,2);
  if (capacity._4_4_ == 0) {
    body_start = 2;
    capacity._4_4_ = ptls_buffer__do_pushv(ppStack_20,"",2);
    if (capacity._4_4_ == 0) {
      sStack_50 = ppStack_20->off;
      capacity_1._7_1_ = kem_local._7_1_;
      capacity._4_4_ = ptls_buffer__do_pushv(ppStack_20,(void *)((long)&capacity_1 + 7),1);
      if (capacity._4_4_ == 0) {
        capacity_1._4_2_ = *(undefined2 *)ciphers_local;
        capacity_1._2_1_ = (undefined1)((ushort)capacity_1._4_2_ >> 8);
        capacity_1._3_1_ = (undefined1)capacity_1._4_2_;
        capacity._4_4_ = ptls_buffer__do_pushv(ppStack_20,(void *)((long)&capacity_1 + 2),2);
        if (capacity._4_4_ == 0) {
          body_start_1 = 2;
          capacity._4_4_ = ptls_buffer__do_pushv(ppStack_20,"",2);
          if (capacity._4_4_ == 0) {
            body_size_1 = ppStack_20->off;
            capacity._4_4_ =
                 ptls_buffer__do_pushv(ppStack_20,buf_local,(size_t)public_key_local.base);
            if (capacity._4_4_ == 0) {
              capacity_2 = ppStack_20->off - body_size_1;
              if (body_start_1 == 0xffffffffffffffff) {
                iVar2 = ptls_buffer__adjust_quic_blocksize(ppStack_20,capacity_2);
                if (iVar2 != 0) {
                  return iVar2;
                }
              }
              else {
                if ((body_start_1 < 8) &&
                   ((ulong)(1L << ((byte)(body_start_1 << 3) & 0x3f)) <= capacity_2)) {
                  return 0x20c;
                }
                for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                  ppStack_20->base[body_size_1 - body_start_1] =
                       (uint8_t)(capacity_2 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                }
              }
              capacity._4_4_ = 0;
              body_start_2 = 2;
              capacity._4_4_ = ptls_buffer__do_pushv(ppStack_20,"",2);
              if (capacity._4_4_ == 0) {
                i = ppStack_20->off;
                for (lStack_88 = 0; capacity._4_4_ = 0,
                    pppStack_38[lStack_88] != (ptls_hpke_cipher_suite_t *)0x0;
                    lStack_88 = lStack_88 + 1) {
                  body_size_2._6_2_ = (pppStack_38[lStack_88]->id).kdf;
                  body_size_2._4_1_ = (undefined1)(body_size_2._6_2_ >> 8);
                  body_size_2._5_1_ = (undefined1)body_size_2._6_2_;
                  capacity._4_4_ =
                       ptls_buffer__do_pushv(ppStack_20,(void *)((long)&body_size_2 + 4),2);
                  if (capacity._4_4_ != 0) {
                    return capacity._4_4_;
                  }
                  body_size_2._2_2_ = (pppStack_38[lStack_88]->id).aead;
                  body_size_2._0_1_ = (undefined1)(body_size_2._2_2_ >> 8);
                  body_size_2._1_1_ = (undefined1)body_size_2._2_2_;
                  iVar2 = ptls_buffer__do_pushv(ppStack_20,&body_size_2,2);
                  if (iVar2 != 0) {
                    return iVar2;
                  }
                }
                local_98 = ppStack_20->off - i;
                if (body_start_2 == 0xffffffffffffffff) {
                  iVar2 = ptls_buffer__adjust_quic_blocksize(ppStack_20,local_98);
                  if (iVar2 != 0) {
                    return iVar2;
                  }
                }
                else {
                  if ((body_start_2 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_2 << 3) & 0x3f)) <= local_98)) {
                    return 0x20c;
                  }
                  for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
                    ppStack_20->base[i - body_start_2] =
                         (uint8_t)(local_98 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
                  }
                }
                capacity._4_4_ = 0;
                capacity_3._7_1_ = max_name_length;
                capacity._4_4_ = ptls_buffer__do_pushv(ppStack_20,(void *)((long)&capacity_3 + 7),1)
                ;
                if (capacity._4_4_ == 0) {
                  body_start_3 = 1;
                  capacity._4_4_ = ptls_buffer__do_pushv(ppStack_20,"",1);
                  buf_00 = ppStack_20;
                  if (capacity._4_4_ == 0) {
                    sVar1 = ppStack_20->off;
                    len = strlen(public_name);
                    capacity._4_4_ = ptls_buffer__do_pushv(buf_00,public_name,len);
                    if (capacity._4_4_ == 0) {
                      uVar3 = ppStack_20->off - sVar1;
                      if (uVar3 < 0x100) {
                        for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
                          ppStack_20->base[sVar1 - body_start_3] =
                               (uint8_t)(uVar3 >> (((char)body_start_3 + -1) * '\b' & 0x3fU));
                        }
                        body_start_4 = 2;
                        capacity._4_4_ = ptls_buffer__do_pushv(ppStack_20,"",2);
                        if (capacity._4_4_ == 0) {
                          sVar1 = ppStack_20->off;
                          uVar3 = ppStack_20->off - sVar1;
                          if (uVar3 < 0x10000) {
                            for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
                              ppStack_20->base[sVar1 - body_start_4] =
                                   (uint8_t)(uVar3 >> (((char)body_start_4 + -1) * '\b' & 0x3fU));
                            }
                            uVar3 = ppStack_20->off - sStack_50;
                            if (body_start == 0xffffffffffffffff) {
                              capacity._4_4_ = ptls_buffer__adjust_quic_blocksize(ppStack_20,uVar3);
                            }
                            else if ((body_start < 8) &&
                                    ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= uVar3)) {
                              capacity._4_4_ = 0x20c;
                            }
                            else {
                              for (; body_start != 0; body_start = body_start - 1) {
                                ppStack_20->base[sStack_50 - body_start] =
                                     (uint8_t)(uVar3 >> (((char)body_start + -1) * '\b' & 0x3fU));
                              }
                            }
                          }
                          else {
                            capacity._4_4_ = 0x20c;
                          }
                        }
                      }
                      else {
                        capacity._4_4_ = 0x20c;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return capacity._4_4_;
}

Assistant:

int ptls_ech_encode_config(ptls_buffer_t *buf, uint8_t config_id, ptls_hpke_kem_t *kem, ptls_iovec_t public_key,
                           ptls_hpke_cipher_suite_t **ciphers, uint8_t max_name_length, const char *public_name)
{
    int ret;

    ptls_buffer_push16(buf, PTLS_ECH_CONFIG_VERSION);
    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, config_id);
        ptls_buffer_push16(buf, kem->id);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, public_key.base, public_key.len); });
        ptls_buffer_push_block(buf, 2, {
            for (size_t i = 0; ciphers[i] != NULL; ++i) {
                ptls_buffer_push16(buf, ciphers[i]->id.kdf);
                ptls_buffer_push16(buf, ciphers[i]->id.aead);
            }
        });
        ptls_buffer_push(buf, max_name_length);
        ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, public_name, strlen(public_name)); });
        ptls_buffer_push_block(buf, 2, {/* extensions */});
    });

Exit:
    return ret;
}